

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_get_forward_list_Test::TestBody(ObjectTest_basic_get_forward_list_Test *this)

{
  undefined8 uVar1;
  pointer *__ptr;
  _Fwd_list_impl local_98;
  AssertHelper local_90 [8];
  undefined1 local_88 [32];
  AssertionResult gtest_ar_;
  object obj;
  
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_u._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._M_index = '\0';
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<bool,_std::allocator<bool>_>,_std::forward_list<bool,_std::allocator<bool>_>,_nullptr>
            ((object *)local_88,(forward_list<bool,_std::allocator<bool>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<bool,_std::allocator<bool>_>::~_Fwd_list_base
            ((_Fwd_list_base<bool,_std::allocator<bool>_> *)local_88);
  std::_Fwd_list_base<bool,_std::allocator<bool>_>::~_Fwd_list_base
            ((_Fwd_list_base<bool,_std::allocator<bool>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<bool>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf6,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<signed_char,_std::allocator<signed_char>_>,_std::forward_list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((object *)local_88,(forward_list<signed_char,_std::allocator<signed_char>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<signed_char,_std::allocator<signed_char>_>::~_Fwd_list_base
            ((_Fwd_list_base<signed_char,_std::allocator<signed_char>_> *)local_88);
  std::_Fwd_list_base<signed_char,_std::allocator<signed_char>_>::~_Fwd_list_base
            ((_Fwd_list_base<signed_char,_std::allocator<signed_char>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<signed char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf7,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_std::forward_list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((object *)local_88,(forward_list<unsigned_char,_std::allocator<unsigned_char>_> *)&obj)
  ;
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Fwd_list_base
            ((_Fwd_list_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  std::_Fwd_list_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Fwd_list_base
            ((_Fwd_list_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<unsigned char>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf8,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<short,_std::allocator<short>_>,_std::forward_list<short,_std::allocator<short>_>,_nullptr>
            ((object *)local_88,(forward_list<short,_std::allocator<short>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<short,_std::allocator<short>_>::~_Fwd_list_base
            ((_Fwd_list_base<short,_std::allocator<short>_> *)local_88);
  std::_Fwd_list_base<short,_std::allocator<short>_>::~_Fwd_list_base
            ((_Fwd_list_base<short,_std::allocator<short>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<short>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf9,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<int,_std::allocator<int>_>,_std::forward_list<int,_std::allocator<int>_>,_nullptr>
            ((object *)local_88,(forward_list<int,_std::allocator<int>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<int,_std::allocator<int>_>::~_Fwd_list_base
            ((_Fwd_list_base<int,_std::allocator<int>_> *)local_88);
  std::_Fwd_list_base<int,_std::allocator<int>_>::~_Fwd_list_base
            ((_Fwd_list_base<int,_std::allocator<int>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<int>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfa,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_88,(forward_list<long,_std::allocator<long>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<long,_std::allocator<long>_>::~_Fwd_list_base
            ((_Fwd_list_base<long,_std::allocator<long>_> *)local_88);
  std::_Fwd_list_base<long,_std::allocator<long>_>::~_Fwd_list_base
            ((_Fwd_list_base<long,_std::allocator<long>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<long>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfb,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_long,_std::allocator<long_long>_>,_std::forward_list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((object *)local_88,(forward_list<long_long,_std::allocator<long_long>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<long_long,_std::allocator<long_long>_>::~_Fwd_list_base
            ((_Fwd_list_base<long_long,_std::allocator<long_long>_> *)local_88);
  std::_Fwd_list_base<long_long,_std::allocator<long_long>_>::~_Fwd_list_base
            ((_Fwd_list_base<long_long,_std::allocator<long_long>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<long long>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfc,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long,_std::allocator<long>_>,_std::forward_list<long,_std::allocator<long>_>,_nullptr>
            ((object *)local_88,(forward_list<long,_std::allocator<long>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<long,_std::allocator<long>_>::~_Fwd_list_base
            ((_Fwd_list_base<long,_std::allocator<long>_> *)local_88);
  std::_Fwd_list_base<long,_std::allocator<long>_>::~_Fwd_list_base
            ((_Fwd_list_base<long,_std::allocator<long>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<intmax_t>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfd,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<float,_std::allocator<float>_>,_std::forward_list<float,_std::allocator<float>_>,_nullptr>
            ((object *)local_88,(forward_list<float,_std::allocator<float>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<float,_std::allocator<float>_>::~_Fwd_list_base
            ((_Fwd_list_base<float,_std::allocator<float>_> *)local_88);
  std::_Fwd_list_base<float,_std::allocator<float>_>::~_Fwd_list_base
            ((_Fwd_list_base<float,_std::allocator<float>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<float>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xfe,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<double,_std::allocator<double>_>,_std::forward_list<double,_std::allocator<double>_>,_nullptr>
            ((object *)local_88,(forward_list<double,_std::allocator<double>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<double,_std::allocator<double>_>::~_Fwd_list_base
            ((_Fwd_list_base<double,_std::allocator<double>_> *)local_88);
  std::_Fwd_list_base<double,_std::allocator<double>_>::~_Fwd_list_base
            ((_Fwd_list_base<double,_std::allocator<double>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<double>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xff,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<long_double,_std::allocator<long_double>_>,_std::forward_list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((object *)local_88,(forward_list<long_double,_std::allocator<long_double>_> *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<long_double,_std::allocator<long_double>_>::~_Fwd_list_base
            ((_Fwd_list_base<long_double,_std::allocator<long_double>_> *)local_88);
  std::_Fwd_list_base<long_double,_std::allocator<long_double>_>::~_Fwd_list_base
            ((_Fwd_list_base<long_double,_std::allocator<long_double>_> *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<long double>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x100,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((object *)local_88,
             (forward_list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&obj);
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)local_88);
  std::
  _Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~_Fwd_list_base((_Fwd_list_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
                     *)&local_98);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<std::u8string>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x101,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  local_98._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base *)0x0;
  jessilib::object::
  get<std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_std::forward_list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((object *)local_88,
             (forward_list<jessilib::object,_std::allocator<jessilib::object>_> *)&obj);
  uVar1 = local_88._0_8_;
  gtest_ar_.success_ = (void *)local_88._0_8_ == (void *)0x0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)local_88);
  std::_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_>::~_Fwd_list_base
            ((_Fwd_list_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_98);
  if ((void *)uVar1 != (void *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_88,&gtest_ar_.success_,
               "obj.get<std::forward_list<object>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0x102,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(local_90);
    std::__cxx11::string::~string((string *)local_88);
    if (local_98._M_head._M_next != (_Fwd_list_node_base *)0x0) {
      (*(code *)(*local_98._M_head._M_next)[1]._M_next)();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&obj);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_forward_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::forward_list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<short>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<int>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<float>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::forward_list<object>>().empty());
}